

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-to-string.cc
# Opt level: O0

bool __thiscall
double_conversion::DoubleToStringConverter::ToPrecision
          (DoubleToStringConverter *this,double value,int precision,StringBuilder *result_builder)

{
  long lVar1;
  bool bVar2;
  int *piVar3;
  int in_ESI;
  DoubleToStringConverter *in_RDI;
  long in_FS_OFFSET;
  double in_XMM0_Qa;
  int i;
  int stop;
  bool as_exponential;
  int extra_zero;
  int exponent;
  bool unique_zero;
  int kDecimalRepCapacity;
  int decimal_rep_length;
  bool sign;
  int decimal_point;
  char decimal_rep [121];
  double in_stack_fffffffffffffed8;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  StringBuilder *in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  int length;
  int in_stack_fffffffffffffef8;
  int iVar4;
  uint in_stack_fffffffffffffefc;
  uint uVar5;
  int in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  undefined4 uVar6;
  char cVar7;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  int iVar8;
  bool local_b1;
  int local_b0 [4];
  byte local_9d;
  int local_9c [4];
  int local_8c;
  char local_88 [24];
  int *in_stack_ffffffffffffff90;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_8c = in_ESI;
  Double::Double((Double *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                 in_stack_fffffffffffffed8);
  bVar2 = Double::IsSpecial((Double *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0))
  ;
  if (bVar2) {
    local_b1 = HandleSpecialValues((DoubleToStringConverter *)
                                   CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                                   (double)CONCAT44(in_stack_fffffffffffffef4,
                                                    in_stack_fffffffffffffef0),
                                   in_stack_fffffffffffffee8);
  }
  else if ((local_8c < 1) || (0x78 < local_8c)) {
    local_b1 = false;
  }
  else {
    local_9c[0] = -0x55555556;
    local_9d = 0xaa;
    memset(local_88,0xaa,0x79);
    local_b0[3] = -0x55555556;
    cVar7 = (char)((ulong)local_9c >> 0x38);
    DoubleToAscii((double)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                  (DtoaMode)((ulong)in_RDI >> 0x20),(int)in_RDI,
                  (char *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                  in_stack_fffffffffffffefc,
                  (bool *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                  (int *)in_stack_fffffffffffffee8,in_stack_ffffffffffffff90);
    if (((local_9d & 1) != 0) &&
       (((in_XMM0_Qa != 0.0 || (NAN(in_XMM0_Qa))) || ((in_RDI->flags_ & 8U) == 0)))) {
      StringBuilder::AddCharacter
                ((StringBuilder *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                 cVar7);
    }
    uVar6 = CONCAT13(1,(int3)in_stack_ffffffffffffff04);
    if (1 - local_9c[0] <= in_RDI->max_leading_padding_zeroes_in_precision_mode_) {
      uVar6 = CONCAT13(in_RDI->max_trailing_padding_zeroes_in_precision_mode_ <
                       (int)((local_9c[0] - local_8c) + (uint)((in_RDI->flags_ & 4U) != 0)),
                       (int3)in_stack_ffffffffffffff04);
    }
    cVar7 = (char)((uint)uVar6 >> 0x18);
    if ((in_RDI->flags_ & 0x10U) != 0) {
      if (cVar7 == '\0') {
        local_b0[2] = 1;
        piVar3 = std::max<int>(local_b0 + 2,local_9c);
        in_stack_ffffffffffffff00 = *piVar3;
        uVar5 = in_stack_fffffffffffffefc;
      }
      else {
        in_stack_ffffffffffffff00 = 1;
        uVar5 = in_stack_fffffffffffffefc;
      }
      while( true ) {
        in_stack_fffffffffffffefc = uVar5 & 0xffffff;
        if (in_stack_ffffffffffffff00 < local_b0[3]) {
          in_stack_fffffffffffffefc = CONCAT13(local_88[local_b0[3] + -1] == '0',(int3)uVar5);
        }
        if ((char)(in_stack_fffffffffffffefc >> 0x18) == '\0') break;
        local_b0[3] = local_b0[3] + -1;
        uVar5 = in_stack_fffffffffffffefc;
      }
      piVar3 = std::min<int>(&local_8c,local_b0 + 3);
      local_8c = *piVar3;
    }
    iVar8 = local_b0[3];
    if (cVar7 == '\0') {
      iVar8 = (int)((ulong)local_88 >> 0x20);
      local_b0[1] = 0;
      local_b0[0] = local_8c - local_9c[0];
      length = local_b0[3];
      iVar4 = local_9c[0];
      std::max<int>(local_b0 + 1,local_b0);
      CreateDecimalRepresentation
                ((DoubleToStringConverter *)CONCAT44(uVar6,in_stack_ffffffffffffff00),
                 (char *)CONCAT44(in_stack_fffffffffffffefc,iVar4),length,in_stack_fffffffffffffef0,
                 iVar8,(StringBuilder *)
                       CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
    }
    else {
      for (; iVar8 < local_8c; iVar8 = iVar8 + 1) {
        local_88[iVar8] = '0';
      }
      CreateExponentialRepresentation
                (in_RDI,(char *)CONCAT44(uVar6,in_stack_ffffffffffffff00),in_stack_fffffffffffffefc,
                 in_stack_fffffffffffffef8,
                 (StringBuilder *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    }
    local_b1 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_b1;
  }
  __stack_chk_fail();
}

Assistant:

bool DoubleToStringConverter::ToPrecision(double value,
                                          int precision,
                                          StringBuilder* result_builder) const {
  if (Double(value).IsSpecial()) {
    return HandleSpecialValues(value, result_builder);
  }

  if (precision < kMinPrecisionDigits || precision > kMaxPrecisionDigits) {
    return false;
  }

  // Find a sufficiently precise decimal representation of n.
  int decimal_point;
  bool sign;
  // Add one for the terminating null character.
  const int kDecimalRepCapacity = kMaxPrecisionDigits + 1;
  char decimal_rep[kDecimalRepCapacity];
  int decimal_rep_length;

  DoubleToAscii(value, PRECISION, precision,
                decimal_rep, kDecimalRepCapacity,
                &sign, &decimal_rep_length, &decimal_point);
  DOUBLE_CONVERSION_ASSERT(decimal_rep_length <= precision);

  bool unique_zero = ((flags_ & UNIQUE_ZERO) != 0);
  if (sign && (value != 0.0 || !unique_zero)) {
    result_builder->AddCharacter('-');
  }

  // The exponent if we print the number as x.xxeyyy. That is with the
  // decimal point after the first digit.
  int exponent = decimal_point - 1;

  int extra_zero = ((flags_ & EMIT_TRAILING_ZERO_AFTER_POINT) != 0) ? 1 : 0;
  bool as_exponential =
      (-decimal_point + 1 > max_leading_padding_zeroes_in_precision_mode_) ||
      (decimal_point - precision + extra_zero >
       max_trailing_padding_zeroes_in_precision_mode_);
  if ((flags_ & NO_TRAILING_ZERO) != 0) {
    // Truncate trailing zeros that occur after the decimal point (if exponential,
    // that is everything after the first digit).
    int stop = as_exponential ? 1 : std::max(1, decimal_point);
    while (decimal_rep_length > stop && decimal_rep[decimal_rep_length - 1] == '0') {
      --decimal_rep_length;
    }
    // Clamp precision to avoid the code below re-adding the zeros.
    precision = std::min(precision, decimal_rep_length);
  }
  if (as_exponential) {
    // Fill buffer to contain 'precision' digits.
    // Usually the buffer is already at the correct length, but 'DoubleToAscii'
    // is allowed to return less characters.
    for (int i = decimal_rep_length; i < precision; ++i) {
      decimal_rep[i] = '0';
    }

    CreateExponentialRepresentation(decimal_rep,
                                    precision,
                                    exponent,
                                    result_builder);
  } else {
    CreateDecimalRepresentation(decimal_rep, decimal_rep_length, decimal_point,
                                (std::max)(0, precision - decimal_point),
                                result_builder);
  }
  return true;
}